

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

text * lest::not_expr(text *__return_storage_ptr__,text *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"! ( ",message);
  std::operator+(&local_50,&local_30," )");
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

inline text not_expr( text message )
{
    return "! ( " + message + " )";
}